

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

int __thiscall wabt::Const::lane_count(Const *this)

{
  Type TVar1;
  
  TVar1 = lane_type(this);
  if (0xfffffff8 < (uint)TVar1.enum_) {
    if ((0x7bU >> (TVar1.enum_ + I32U & 0x1fU) & 1) != 0) {
      return *(int *)(&DAT_001a451c + (long)(TVar1.enum_ + I32U) * 4);
    }
  }
  abort();
}

Assistant:

int lane_count() const {
    switch (lane_type()) {
      case Type::I8:  return 16;
      case Type::I16: return 8;
      case Type::I32: return 4;
      case Type::I64: return 2;
      case Type::F32: return 4;
      case Type::F64: return 2;
      default: WABT_UNREACHABLE;
    }
  }